

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::GetProtoPackagePrefixExceptionList_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)&DAT_004e1380);
  return in_RDI;
}

Assistant:

std::string GetProtoPackagePrefixExceptionList() {
  return g_prefix_mode.exception_path();
}